

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qwindowsysteminterface.cpp
# Opt level: O3

bool QWindowSystemHelper<QWindowSystemInterface::SynchronousDelivery>::
     handleEvent<QWindowSystemInterfacePrivate::WheelEvent,QWindow*,unsigned_long,QPointF,QPointF,QPoint,QPoint,int,Qt::Orientation,QFlags<Qt::KeyboardModifier>,Qt::ScrollPhase,Qt::MouseEventSource,bool,QPointingDevice_const*>
               (QWindow *args,unsigned_long args_1,QPointF args_2,QPointF args_3,QPoint args_4,
               QPoint args_5,int args_6,Orientation args_7,QFlags<Qt::KeyboardModifier> args_8,
               ScrollPhase args_9,MouseEventSource args_10,bool args_11,QPointingDevice *args_12)

{
  char cVar1;
  bool bVar2;
  int iVar3;
  undefined1 uVar4;
  int *piVar5;
  long in_FS_OFFSET;
  WindowSystemEvent local_c0;
  int *local_a8;
  QWindow *local_a0;
  unsigned_long local_98;
  QFlagsStorage<Qt::KeyboardModifier> local_90;
  QPointingDevice *local_88;
  QPoint local_80;
  QPoint local_78;
  int local_70;
  Orientation local_6c;
  qreal local_68;
  qreal local_60;
  qreal local_58;
  qreal local_50;
  ScrollPhase local_48;
  MouseEventSource local_44;
  undefined1 local_40;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  cVar1 = QThread::isMainThread();
  if (cVar1 == '\0') {
    QWindowSystemHelper<QWindowSystemInterface::AsynchronousDelivery>::
    handleEvent<QWindowSystemInterfacePrivate::WheelEvent,QWindow*,unsigned_long,QPointF,QPointF,QPoint,QPoint,int,Qt::Orientation,QFlags<Qt::KeyboardModifier>,Qt::ScrollPhase,Qt::MouseEventSource,bool,QPointingDevice_const*>
              (args,args_1,args_2,args_3,args_4,args_5,args_6,args_7,args_8,args_9,args_10,args_11,
               args_12);
    if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
      bVar2 = QWindowSystemInterface::flushWindowSystemEvents((ProcessEventsFlags)0x0);
      return bVar2;
    }
  }
  else {
    memcpy(&local_c0,&DAT_0068f1a0,0x88);
    local_c0.type = Wheel;
    local_c0.flags = 0;
    local_c0.eventAccepted = true;
    if (args == (QWindow *)0x0) {
      local_c0.type = Wheel;
      local_c0.flags = 2;
      local_a8 = (int *)0x0;
    }
    else {
      local_a8 = (int *)QtSharedPointer::ExternalRefCountData::getAndRef(&args->super_QObject);
    }
    local_90.i = (Int)args_8.super_QFlagsStorageHelper<Qt::KeyboardModifier,_4>.
                      super_QFlagsStorage<Qt::KeyboardModifier>.i;
    local_88 = args_12;
    local_c0._vptr_WindowSystemEvent = (_func_int **)&PTR__UserEvent_007d8f60;
    local_48 = args_9;
    local_44 = args_10;
    local_40 = args_11;
    local_a0 = args;
    local_98 = args_1;
    local_80 = args_4;
    local_78 = args_5;
    local_70 = args_6;
    local_6c = args_7;
    local_68 = args_2.xp;
    local_60 = args_2.yp;
    local_58 = args_3.xp;
    local_50 = args_3.yp;
    if (QWindowSystemInterfacePrivate::eventHandler == (QWindowSystemEventHandler *)0x0) {
      QGuiApplicationPrivate::processWindowSystemEvent(&local_c0);
      uVar4 = local_c0.eventAccepted;
    }
    else {
      iVar3 = (*QWindowSystemInterfacePrivate::eventHandler->_vptr_QWindowSystemEventHandler[2])
                        (QWindowSystemInterfacePrivate::eventHandler,&local_c0);
      uVar4 = local_c0.eventAccepted;
      if ((char)iVar3 == '\0') {
        uVar4 = 0;
      }
    }
    local_c0._vptr_WindowSystemEvent = (_func_int **)&PTR__UserEvent_007d41f0;
    if (local_a8 != (int *)0x0) {
      LOCK();
      *local_a8 = *local_a8 + -1;
      UNLOCK();
      if (*local_a8 == 0) {
        piVar5 = local_a8;
        if (local_a8 == (int *)0x0) {
          piVar5 = (int *)0x0;
        }
        operator_delete(piVar5);
      }
    }
    if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
      return (bool)uVar4;
    }
  }
  __stack_chk_fail();
}

Assistant:

bool QWindowSystemHelper<QWindowSystemInterface::SynchronousDelivery>::handleEvent(Args ...args)
{
    if (QThread::isMainThread()) {
        EventType event(args...);
        // Process the event immediately on the Gui thread and return the accepted state
        if (QWindowSystemInterfacePrivate::eventHandler) {
            if (!QWindowSystemInterfacePrivate::eventHandler->sendEvent(&event))
                return false;
        } else {
            QGuiApplicationPrivate::processWindowSystemEvent(&event);
        }
        return event.eventAccepted;
    } else {
        // Post the event on the Qt main thread queue and flush the queue.
        // This will wake up the Gui thread which will process the event.
        // Return the accepted state for the last event on the queue,
        // which is the event posted by this function.
        QWindowSystemHelper<QWindowSystemInterface::AsynchronousDelivery>::handleEvent<EventType>(args...);
        return QWindowSystemInterface::flushWindowSystemEvents();
    }
}